

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void write_macros_cb(void *ctx0,CTcHashEntryPp *entry)

{
  CVmFile *this;
  CTcHashEntryPpArg *pCVar1;
  uint16_t tmp;
  int iVar2;
  int iVar3;
  CVmHashEntry *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  char b [2];
  char b_1 [2];
  char b_2 [2];
  char b_3 [4];
  undefined2 local_34;
  undefined2 local_32;
  ushort local_30;
  undefined2 local_2e;
  int local_2c;
  
  this = *ctx0;
  iVar2 = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[8])(entry);
  if (iVar2 == 0) {
    pCVar4 = CVmHashTable::find(G_tok->undefs_,(entry->super_CVmHashEntryCS).super_CVmHashEntry.str_
                                ,(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_);
    if (pCVar4 == (CVmHashEntry *)0x0) {
      *(long *)((long)ctx0 + 8) = *(long *)((long)ctx0 + 8) + 1;
      local_32 = (undefined2)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_;
      CVmFile::write_bytes(this,(char *)&local_32,2);
      CVmFile::write_bytes
                (this,(entry->super_CVmHashEntryCS).super_CVmHashEntry.str_,
                 (entry->super_CVmHashEntryCS).super_CVmHashEntry.len_);
      local_30 = (byte)entry->field_0x44 & 3;
      CVmFile::write_bytes(this,(char *)&local_30,2);
      local_2e = (undefined2)entry->argc_;
      CVmFile::write_bytes(this,(char *)&local_2e,2);
      if (0 < entry->argc_) {
        lVar5 = 0;
        do {
          pCVar1 = entry->arg_entry_[lVar5];
          local_34 = (undefined2)(pCVar1->super_CVmHashEntryCS).super_CVmHashEntry.len_;
          CVmFile::write_bytes(this,(char *)&local_34,2);
          CVmFile::write_bytes
                    (this,(pCVar1->super_CVmHashEntryCS).super_CVmHashEntry.str_,
                     (pCVar1->super_CVmHashEntryCS).super_CVmHashEntry.len_);
          lVar5 = lVar5 + 1;
        } while (lVar5 < entry->argc_);
      }
      local_2c = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[6])(entry);
      CVmFile::write_bytes(this,(char *)&local_2c,4);
      iVar2 = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[5])(entry);
      iVar3 = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[6])(entry);
      CVmFile::write_bytes
                (this,(char *)CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
    }
  }
  return;
}

Assistant:

static void write_macros_cb(void *ctx0, CTcHashEntryPp *entry)
{
    write_macro_ctx_t *ctx = (write_macro_ctx_t *)ctx0;
    int flags;
    int i;
    CVmFile *fp = ctx->fp;

    /* 
     *   if this is a pseudo-macro (such as __LINE__ or __FILE__), ignore it
     *   - these macros do not have permanent global definitions, so they're
     *   not usable in the debugger 
     */
    if (entry->is_pseudo())
        return;

    /* 
     *   If the macro was ever redefined or undefined, ignore it - the
     *   debugger can only use truly global macros, which are macros that
     *   have stable meanings throughout the compilation units where they
     *   appear (and which do not have different meanings in different
     *   compilation units, but that's not our concern at the moment).  The
     *   preprocessor keeps an "undef" table of everything undefined
     *   (explicitly, or implicitly via redefinition), so look up this macro
     *   in the undef table, and ignore the macro if it we find it.  
     */
    if (G_tok->find_undef(entry->getstr(), entry->getlen()) != 0)
        return;

    /* count this macro */
    ctx->cnt++;

    /* write the macro's name */
    fp->write_uint2(entry->getlen());
    fp->write_bytes(entry->getstr(), entry->getlen());

    /* write the flag bits */
    flags = 0;
    if (entry->has_args()) flags |= 1;
    if (entry->has_varargs()) flags |= 2;
    fp->write_uint2(flags);

    /* write the number of arguments, and write each argument */
    fp->write_uint2(entry->get_argc());
    for (i = 0 ; i < entry->get_argc() ; ++i)
    {
        CTcHashEntryPpArg *arg;

        /* get the argument */
        arg = entry->get_arg_entry(i);

        /* write the parameter name */
        fp->write_uint2(arg->getlen());
        fp->write_bytes(arg->getstr(), arg->getlen());
    }

    /* write the expansion */
    fp->write_uint4(entry->get_orig_expan_len());
    fp->write_bytes(entry->get_orig_expansion(), entry->get_orig_expan_len());
}